

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Add_constant_patch64(int g_a,int64_t *lo,int64_t *hi,void *alpha)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar5 = &lStack_60 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = lo[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  pIVar2 = aIStack_98 + IVar1;
  for (lVar4 = 0; pIVar2 = pIVar2 + -1, lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = hi[lVar4] + 1;
  }
  pnga_add_constant_patch((long)g_a,local_58,aIStack_98,alpha);
  return;
}

Assistant:

void GA_Add_constant_patch64(int g_a, int64_t *lo, int64_t *hi, void *alpha)
{
    Integer a = (Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    wnga_add_constant_patch(a, _ga_lo, _ga_hi, alpha);
}